

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_test.cc
# Opt level: O1

void __thiscall leveldb::EnvTest_ReadWrite_Test::TestBody(EnvTest_ReadWrite_Test *this)

{
  AssertHelper *this_00;
  Env *pEVar1;
  pointer pcVar2;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar3;
  size_type sVar4;
  undefined8 *puVar5;
  EnvTest_ReadWrite_Test *pEVar6;
  uint uVar7;
  UnitTest *this_01;
  uint uVar8;
  int iVar9;
  char *pcVar10;
  _Alloc_hider _Var11;
  AssertionResult *this_02;
  Random rnd;
  Slice read;
  AssertionResult gtest_ar_7;
  string read_result;
  int len;
  string scratch;
  string data;
  WritableFile *writable_file;
  string test_file_name;
  string test_dir;
  SequentialFile *sequential_file;
  Random local_124;
  AssertionResult local_120;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_110;
  AssertionResult local_108;
  string local_f8;
  uint local_d4;
  AssertHelper local_d0;
  undefined8 *local_c8;
  undefined1 local_c0 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  long *local_88;
  undefined8 *local_80;
  undefined8 *local_78;
  undefined8 local_70 [2];
  undefined1 *local_60;
  long local_58;
  undefined1 local_50 [16];
  long *local_40;
  EnvTest_ReadWrite_Test *local_38;
  
  this_01 = testing::UnitTest::GetInstance();
  uVar7 = testing::UnitTest::random_seed(this_01);
  local_124.seed_ = uVar7 & 0x7fffffff;
  if ((local_124.seed_ == 0x7fffffff) || (local_124.seed_ == 0)) {
    local_124.seed_ = 1;
  }
  local_60 = local_50;
  local_58 = 0;
  local_50[0] = 0;
  pEVar1 = (this->super_EnvTest).env_;
  (*pEVar1->_vptr_Env[0x13])(&local_a8,pEVar1,&local_60);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_80,
             (char *)&local_f8,(Status *)"env_->GetTestDirectory(&test_dir)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete__(local_a8._M_dataplus._M_p);
  }
  if (local_80._0_1_ == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_78 == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_78;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_test.cc"
               ,0x1f,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_a8._M_dataplus._M_p + 8))();
    }
    if (local_78 == (undefined8 *)0x0) goto LAB_0010aa0a;
    if ((undefined8 *)*local_78 != local_78 + 2) {
      operator_delete((undefined8 *)*local_78);
    }
  }
  else {
    if (local_78 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_78 != local_78 + 2) {
        operator_delete((undefined8 *)*local_78);
      }
      operator_delete(local_78);
    }
    local_80 = local_70;
    std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_60,local_60 + local_58);
    std::__cxx11::string::append((char *)&local_80);
    pEVar1 = (this->super_EnvTest).env_;
    (*pEVar1->_vptr_Env[4])(&local_f8,pEVar1,(string *)&local_80,&local_88);
    testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
              ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_a8,
               (char *)&local_d0,(Status *)"env_->NewWritableFile(test_file_name, &writable_file)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete__(local_f8._M_dataplus._M_p);
    }
    if ((char)local_a8._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_a8._M_string_length ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar10 = "";
      }
      else {
        pcVar10 = (char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)local_a8._M_string_length)->_M_allocated_capacity;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_test.cc"
                 ,0x22,pcVar10);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_f8._M_dataplus._M_p + 8))();
      }
      _Var11._M_p = (pointer)local_a8._M_string_length;
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_a8._M_string_length !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_string_length)->_M_allocated_capacity !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_a8._M_string_length + 0x10)) {
          operator_delete((undefined1 *)
                          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)local_a8._M_string_length)->_M_allocated_capacity);
        }
        goto LAB_0010a9f3;
      }
    }
    else {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_a8._M_string_length !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_string_length)->_M_allocated_capacity !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_a8._M_string_length + 0x10)) {
          operator_delete((undefined1 *)
                          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)local_a8._M_string_length)->_M_allocated_capacity);
        }
        operator_delete((void *)local_a8._M_string_length);
      }
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      local_a8._M_string_length = 0;
      local_a8.field_2._M_local_buf[0] = '\0';
      local_38 = this;
      do {
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        uVar8 = (int)((ulong)local_124.seed_ * 0x41a7 >> 0x1f) +
                ((uint)((ulong)local_124.seed_ * 0x41a7) & 0x7fffffff);
        uVar7 = uVar8 + 0x80000001;
        if (-1 < (int)uVar8) {
          uVar7 = uVar8;
        }
        uVar8 = (int)((ulong)uVar7 * 0x41a7 >> 0x1f) + ((uint)((ulong)uVar7 * 0x41a7) & 0x7fffffff);
        local_124.seed_ = uVar8 + 0x80000001;
        if (-1 < (int)uVar8) {
          local_124.seed_ = uVar8;
        }
        local_f8._M_string_length = 0;
        local_f8.field_2._M_local_buf[0] = '\0';
        test::RandomString(&local_124,
                           ~(-1 << ((char)uVar7 + (char)(uVar7 / 0x13) * -0x13 & 0x1fU)) &
                           local_124.seed_,&local_f8);
        local_120._0_8_ = local_f8._M_dataplus._M_p;
        local_120.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )local_f8._M_string_length;
        (**(code **)(*local_88 + 0x10))(&local_108,local_88,&local_120);
        testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                  ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_d0,
                   (char *)&local_40,(Status *)"writable_file->Append(r)");
        if ((void *)CONCAT71(local_108._1_7_,local_108.success_) != (void *)0x0) {
          operator_delete__((void *)CONCAT71(local_108._1_7_,local_108.success_));
        }
        puVar5 = local_c8;
        if (local_d0.data_._0_1_ == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0)
        {
          testing::Message::Message((Message *)&local_120);
          if (local_c8 == (undefined8 *)0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = (char *)*local_c8;
          }
          iVar9 = 0x2b;
LAB_0010a88d:
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_108,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_test.cc"
                     ,iVar9,pcVar10);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_108,(Message *)&local_120);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_120._0_8_ + 8))();
          }
          puVar5 = local_c8;
          if (local_c8 != (undefined8 *)0x0) {
            if ((undefined8 *)*local_c8 != local_c8 + 2) {
              operator_delete((undefined8 *)*local_c8);
            }
            operator_delete(puVar5);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) goto LAB_0010a8f6;
          goto LAB_0010a9e6;
        }
        if (local_c8 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_c8 != local_c8 + 2) {
            operator_delete((undefined8 *)*local_c8);
          }
          operator_delete(puVar5);
        }
        std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_f8._M_dataplus._M_p);
        uVar7 = (uint)((ulong)local_124.seed_ * 0x41a7) & 0x7fffffff;
        iVar9 = (int)((ulong)local_124.seed_ * 0x41a7 >> 0x1f);
        uVar8 = iVar9 + uVar7;
        local_124.seed_ = iVar9 + uVar7 + 0x80000001;
        if (-1 < (int)uVar8) {
          local_124.seed_ = uVar8;
        }
        if ((local_124.seed_ * -0x33333333 >> 1 |
            (uint)((local_124.seed_ * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a) {
          (**(code **)(*local_88 + 0x20))(&local_120);
          testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                    ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_d0,
                     &local_108.success_,(Status *)"writable_file->Flush()");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete__((void *)local_120._0_8_);
          }
          puVar5 = local_c8;
          if (local_d0.data_._0_1_ == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0
             ) {
            testing::Message::Message((Message *)&local_120);
            if (local_c8 == (undefined8 *)0x0) {
              pcVar10 = "";
            }
            else {
              pcVar10 = (char *)*local_c8;
            }
            iVar9 = 0x2e;
            goto LAB_0010a88d;
          }
          if (local_c8 != (undefined8 *)0x0) {
            if ((undefined8 *)*local_c8 != local_c8 + 2) {
              operator_delete((undefined8 *)*local_c8);
            }
            operator_delete(puVar5);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p);
        }
      } while (local_a8._M_string_length <
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xa00000);
      (**(code **)(*local_88 + 0x28))(&local_d0);
      testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_f8,
                 &local_120.success_,(Status *)"writable_file->Sync()");
      if (local_d0.data_ != (AssertHelperData *)0x0) {
        operator_delete__(local_d0.data_);
      }
      pEVar6 = local_38;
      sVar4 = local_f8._M_string_length;
      if ((char)local_f8._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_d0);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_f8._M_string_length ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = ((_Alloc_hider *)local_f8._M_string_length)->_M_p;
        }
        iVar9 = 0x31;
LAB_0010a939:
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_120,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_test.cc"
                   ,iVar9,pcVar10);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)&local_d0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
        if (local_d0.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_d0.data_ + 8))();
        }
        sVar4 = local_f8._M_string_length;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_f8._M_string_length !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = ((_Alloc_hider *)local_f8._M_string_length)->_M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar2 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_f8._M_string_length + 0x10)) {
            operator_delete(pcVar2);
          }
          operator_delete((void *)sVar4);
        }
      }
      else {
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_f8._M_string_length !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = ((_Alloc_hider *)local_f8._M_string_length)->_M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar2 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_f8._M_string_length + 0x10)) {
            operator_delete(pcVar2);
          }
          operator_delete((void *)sVar4);
        }
        (**(code **)(*local_88 + 0x18))(&local_d0);
        testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                  ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_f8,
                   &local_120.success_,(Status *)"writable_file->Close()");
        if (local_d0.data_ != (AssertHelperData *)0x0) {
          operator_delete__(local_d0.data_);
        }
        sVar4 = local_f8._M_string_length;
        if ((char)local_f8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_d0);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_f8._M_string_length ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = ((_Alloc_hider *)local_f8._M_string_length)->_M_p;
          }
          iVar9 = 0x32;
          goto LAB_0010a939;
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_f8._M_string_length !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = ((_Alloc_hider *)local_f8._M_string_length)->_M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar2 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_f8._M_string_length + 0x10)) {
            operator_delete(pcVar2);
          }
          operator_delete((void *)sVar4);
        }
        if (local_88 != (long *)0x0) {
          (**(code **)(*local_88 + 8))();
        }
        pEVar1 = (pEVar6->super_EnvTest).env_;
        (*pEVar1->_vptr_Env[2])(&local_d0,pEVar1,&local_80,&local_40);
        testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                  ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_f8,
                   &local_120.success_,
                   (Status *)"env_->NewSequentialFile(test_file_name, &sequential_file)");
        if (local_d0.data_ != (AssertHelperData *)0x0) {
          operator_delete__(local_d0.data_);
        }
        if ((char)local_f8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_d0);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_f8._M_string_length ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = ((_Alloc_hider *)local_f8._M_string_length)->_M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_120,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_test.cc"
                     ,0x37,pcVar10);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_120,(Message *)&local_d0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
          if (local_d0.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_d0.data_ + 8))();
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_f8);
        }
        else {
          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_f8);
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          local_f8._M_string_length = 0;
          local_f8.field_2._M_local_buf[0] = '\0';
          local_d0.data_ = (AssertHelperData *)local_c0;
          local_c8 = (undefined8 *)0x0;
          local_c0[0] = kSuccess;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_a8._M_string_length !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar10 = "";
            do {
              uVar8 = (int)((ulong)local_124.seed_ * 0x41a7 >> 0x1f) +
                      ((uint)((ulong)local_124.seed_ * 0x41a7) & 0x7fffffff);
              uVar7 = uVar8 + 0x80000001;
              if (-1 < (int)uVar8) {
                uVar7 = uVar8;
              }
              uVar8 = (int)((ulong)uVar7 * 0x41a7 >> 0x1f) +
                      ((uint)((ulong)uVar7 * 0x41a7) & 0x7fffffff);
              local_124.seed_ = uVar8 + 0x80000001;
              if (-1 < (int)uVar8) {
                local_124.seed_ = uVar8;
              }
              uVar7 = ~(-1 << ((char)uVar7 + (char)(uVar7 / 0x13) * -0x13 & 0x1fU)) &
                      local_124.seed_;
              local_d4 = (int)local_a8._M_string_length - (int)local_f8._M_string_length;
              if ((int)uVar7 < (int)local_d4) {
                local_d4 = uVar7;
              }
              uVar7 = local_d4;
              if ((int)local_d4 < 2) {
                uVar7 = 1;
              }
              std::__cxx11::string::resize((ulong)&local_d0,(char)uVar7);
              local_120._0_8_ = "";
              local_120.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              (**(code **)(*local_40 + 0x10))
                        (&local_110,local_40,(long)(int)local_d4,&local_120,local_d0.data_);
              testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::
              operator()((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_108,
                         local_c0 + 0x10,(Status *)"sequential_file->Read(len, &read, &scratch[0])")
              ;
              if (local_110._M_head_impl !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                operator_delete__(local_110._M_head_impl);
              }
              uVar3._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )local_108.message_;
              if (local_108.success_ == false) {
                testing::Message::Message((Message *)&local_110);
                if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )local_108.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar10 = *(char **)local_108.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl;
                }
                this_00 = (AssertHelper *)(local_c0 + 0x10);
                testing::internal::AssertHelper::AssertHelper
                          (this_00,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_test.cc"
                           ,0x3e,pcVar10);
                testing::internal::AssertHelper::operator=(this_00,(Message *)&local_110);
                testing::internal::AssertHelper::~AssertHelper(this_00);
joined_r0x0010aac9:
                if (local_110._M_head_impl !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  (**(code **)(((local_110._M_head_impl)->_M_dataplus)._M_p + 8))();
                }
                this_02 = &local_108;
                goto LAB_0010abfc;
              }
              if (local_108.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pcVar2 = ((_Alloc_hider *)
                         local_108.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl)->_M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar2 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)local_108.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 0x10)) {
                  operator_delete(pcVar2);
                }
                operator_delete((void *)uVar3._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl);
              }
              if (0 < (int)local_d4) {
                local_110._M_head_impl =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_120.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
                local_c0._16_4_ = 0;
                testing::internal::CmpHelperGT<unsigned_long,int>
                          ((internal *)&local_108,"read.size()","0",(unsigned_long *)&local_110,
                           (int *)(local_c0 + 0x10));
                uVar3._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )local_108.message_;
                if (local_108.success_ != false) {
                  if (local_108.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl !=
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    pcVar2 = ((_Alloc_hider *)
                             local_108.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl)->_M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)pcVar2 !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)local_108.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl + 0x10)) {
                      operator_delete(pcVar2);
                    }
                    operator_delete((void *)uVar3._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl);
                  }
                  goto LAB_0010a56d;
                }
                testing::Message::Message((Message *)&local_110);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )local_108.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar10 = "";
                }
                else {
                  pcVar10 = *(char **)local_108.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl;
                }
                iVar9 = 0x40;
LAB_0010abcc:
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)(local_c0 + 0x10),kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_test.cc"
                           ,iVar9,pcVar10);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)(local_c0 + 0x10),(Message *)&local_110);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_c0 + 0x10));
                goto joined_r0x0010aac9;
              }
LAB_0010a56d:
              local_110._M_head_impl =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_120.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
              testing::internal::CmpHelperLE<unsigned_long,int>
                        ((internal *)&local_108,"read.size()","len",(unsigned_long *)&local_110,
                         (int *)&local_d4);
              uVar3._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )local_108.message_;
              if (local_108.success_ == false) {
                testing::Message::Message((Message *)&local_110);
                if ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )local_108.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     )0x0) {
                  pcVar10 = "";
                }
                else {
                  pcVar10 = *(char **)local_108.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl;
                }
                iVar9 = 0x42;
                goto LAB_0010abcc;
              }
              if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )local_108.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*(undefined8 **)
                        local_108.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)local_108.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 0x10)) {
                  operator_delete(*(undefined8 **)
                                   local_108.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl);
                }
                operator_delete((void *)uVar3._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl);
              }
              std::__cxx11::string::append((char *)&local_f8,local_120._0_8_);
            } while (local_f8._M_string_length < local_a8._M_string_length);
          }
          testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                    ((internal *)&local_120,"read_result","data",&local_f8,&local_a8);
          if (local_120.success_ == false) {
            testing::Message::Message((Message *)&local_108);
            if ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 )local_120.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 )0x0) {
              pcVar10 = "";
            }
            else {
              pcVar10 = ((_Alloc_hider *)
                        local_120.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl)->_M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_110,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_test.cc"
                       ,0x45,pcVar10);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_110,(Message *)&local_108);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
            if ((long *)CONCAT71(local_108._1_7_,local_108.success_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_108._1_7_,local_108.success_) + 8))();
            }
            this_02 = &local_120;
LAB_0010abfc:
            testing::AssertionResult::~AssertionResult(this_02);
          }
          else {
            testing::AssertionResult::~AssertionResult(&local_120);
            if (local_40 != (long *)0x0) {
              (**(code **)(*local_40 + 8))();
            }
          }
          if (local_d0.data_ != (AssertHelperData *)local_c0) {
            operator_delete(local_d0.data_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
LAB_0010a8f6:
            operator_delete(local_f8._M_dataplus._M_p);
          }
        }
      }
LAB_0010a9e6:
      _Var11._M_p = local_a8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
LAB_0010a9f3:
        operator_delete(_Var11._M_p);
      }
    }
    local_78 = local_80;
    if (local_80 == local_70) goto LAB_0010aa0a;
  }
  operator_delete(local_78);
LAB_0010aa0a:
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  return;
}

Assistant:

TEST_F(EnvTest, ReadWrite) {
  Random rnd(test::RandomSeed());

  // Get file to use for testing.
  std::string test_dir;
  ASSERT_LEVELDB_OK(env_->GetTestDirectory(&test_dir));
  std::string test_file_name = test_dir + "/open_on_read.txt";
  WritableFile* writable_file;
  ASSERT_LEVELDB_OK(env_->NewWritableFile(test_file_name, &writable_file));

  // Fill a file with data generated via a sequence of randomly sized writes.
  static const size_t kDataSize = 10 * 1048576;
  std::string data;
  while (data.size() < kDataSize) {
    int len = rnd.Skewed(18);  // Up to 2^18 - 1, but typically much smaller
    std::string r;
    test::RandomString(&rnd, len, &r);
    ASSERT_LEVELDB_OK(writable_file->Append(r));
    data += r;
    if (rnd.OneIn(10)) {
      ASSERT_LEVELDB_OK(writable_file->Flush());
    }
  }
  ASSERT_LEVELDB_OK(writable_file->Sync());
  ASSERT_LEVELDB_OK(writable_file->Close());
  delete writable_file;

  // Read all data using a sequence of randomly sized reads.
  SequentialFile* sequential_file;
  ASSERT_LEVELDB_OK(env_->NewSequentialFile(test_file_name, &sequential_file));
  std::string read_result;
  std::string scratch;
  while (read_result.size() < data.size()) {
    int len = std::min<int>(rnd.Skewed(18), data.size() - read_result.size());
    scratch.resize(std::max(len, 1));  // at least 1 so &scratch[0] is legal
    Slice read;
    ASSERT_LEVELDB_OK(sequential_file->Read(len, &read, &scratch[0]));
    if (len > 0) {
      ASSERT_GT(read.size(), 0);
    }
    ASSERT_LE(read.size(), len);
    read_result.append(read.data(), read.size());
  }
  ASSERT_EQ(read_result, data);
  delete sequential_file;
}